

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__surface____glsl_surface_type
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  long lVar1;
  bool bVar2;
  StringHash SVar3;
  long lVar4;
  xmlChar **ppxVar5;
  bool local_39;
  surface____glsl_surface_type__AttributeData *local_38;
  
  local_38 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL14::surface____glsl_surface_type__AttributeData>
                       ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar5 = attributes->attributes;
  if (ppxVar5 == (xmlChar **)0x0) {
LAB_006dfeca:
    if ((local_38->type == ENUM__fx_surface_type_enum__NOT_PRESENT) &&
       (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_REQUIRED_ATTRIBUTE_MISSING,0xac8c7e5,0x7c065,(ParserChar *)0x0),
       bVar2)) {
      return false;
    }
    return true;
  }
LAB_006dfe1a:
  do {
    text = *ppxVar5;
    if (text == (ParserChar *)0x0) goto LAB_006dfeca;
    SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
    additionalText = ppxVar5[1];
    ppxVar5 = ppxVar5 + 2;
    if (SVar3 == 0x7c065) {
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(additionalText,&local_39);
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        if (lVar4 + 0x10 == 0x80) {
          local_39 = true;
          local_38->type = ENUM__fx_surface_type_enum__COUNT;
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xac8c7e5,0x7c065,additionalText);
          if (bVar2) {
            return false;
          }
          goto LAB_006dfe1a;
        }
        lVar1 = lVar4 + 0x10;
      } while (*(StringHash *)((long)&ENUM__fx_surface_type_enumMap + lVar4) != SVar3);
      local_38->type = *(ENUM__fx_surface_type_enum *)((long)&DAT_0086c2a8 + lVar4);
    }
    else {
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_UNKNOWN_ATTRIBUTE,0xac8c7e5,text,additionalText);
      if (bVar2) {
        return false;
      }
    }
  } while( true );
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__surface____glsl_surface_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__surface____glsl_surface_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

surface____glsl_surface_type__AttributeData* attributeData = newData<surface____glsl_surface_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_type:
    {
bool failed;
attributeData->type = Utils::toEnum<ENUM__fx_surface_type_enum, StringHash, ENUM__fx_surface_type_enum__COUNT>(attributeValue, failed, ENUM__fx_surface_type_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SURFACE,
        HASH_ATTRIBUTE_type,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SURFACE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->type == ENUM__fx_surface_type_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_SURFACE, HASH_ATTRIBUTE_type, 0 ) )
        return false;
}


    return true;
}